

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O2

void fileToMsg(string *filename,Msg *msg)

{
  string s;
  string local_30;
  
  strcpy(msg->buf,(filename->_M_dataplus)._M_p);
  read_all_lines_one_abi_cxx11_(&local_30,(filename->_M_dataplus)._M_p);
  strcpy(msg->buf2,local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void fileToMsg(String filename, Msg &msg){
    sprintf(msg.buf,"%s",filename.c_str());
    String s = read_all_lines_one(filename.c_str());
    sprintf(msg.buf2,"%s",s.c_str());
}